

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 15-extract-template-function.cpp
# Opt level: O0

void fun<int>(env *lest_env,int *a,int *b)

{
  ostream *os;
  bool bVar1;
  failure *this;
  undefined1 local_238 [72];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  location local_1a8;
  message local_180;
  undefined1 local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  location local_90;
  expression_decomposer local_51;
  int *local_50;
  undefined1 local_48 [8];
  result score;
  int *b_local;
  int *a_local;
  env *lest_env_local;
  
  score._32_8_ = b;
  do {
    local_50 = (int *)lest::expression_decomposer::operator<<(&local_51,a);
    lest::expression_lhs<int_const&>::operator==
              ((result *)local_48,(expression_lhs<int_const&> *)&local_50,(int *)score._32_8_);
    bVar1 = lest::result::operator_cast_to_bool((result *)local_48);
    if (bVar1) {
      local_101 = 1;
      this = (failure *)__cxa_allocate_exception(0x78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-template-function.cpp"
                 ,&local_b1);
      lest::location::location(&local_90,(text *)local_b0,0xc);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"a == b",&local_d9);
      std::__cxx11::string::string(local_100,(string *)&score);
      lest::failure::failure(this,&local_90,(text *)local_d8,(text *)local_100);
      local_101 = 0;
      __cxa_throw(this,&lest::failure::typeinfo,lest::failure::~failure);
    }
    bVar1 = lest::env::pass(lest_env);
    if (bVar1) {
      os = lest_env->os;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]lest/example/15-extract-template-function.cpp"
                 ,&local_1c9);
      lest::location::location(&local_1a8,(text *)local_1c8,0xc);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f0,"a == b",(allocator *)(local_238 + 0x47));
      std::__cxx11::string::string((string *)(local_238 + 0x20),(string *)&score);
      bVar1 = lest::env::zen(lest_env);
      lest::passing::passing
                ((passing *)&local_180,&local_1a8,(text *)local_1f0,(text *)(local_238 + 0x20),bVar1
                );
      lest::env::context_abi_cxx11_((env *)local_238);
      lest::report(os,&local_180,(text *)local_238);
      std::__cxx11::string::~string((string *)local_238);
      lest::passing::~passing((passing *)&local_180);
      std::__cxx11::string::~string((string *)(local_238 + 0x20));
      std::__cxx11::string::~string(local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)(local_238 + 0x47));
      lest::location::~location(&local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    }
    lest::result::~result((result *)local_48);
    bVar1 = lest::is_false();
  } while (bVar1);
  return;
}

Assistant:

void fun( lest::env & lest_env, T const & a, T const & b )
{
    EXPECT( a == b );
}